

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O2

ssize_t __thiscall
Pl_ASCIIHexDecoder::write(Pl_ASCIIHexDecoder *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  int iVar2;
  ssize_t in_RAX;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  void *pvVar3;
  char t [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->eod == false) {
    pvVar3 = (void *)0x0;
    do {
      if (__buf == pvVar3) {
        return in_RAX;
      }
      iVar2 = toupper((uint)*(byte *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3));
      in_RAX = CONCAT44(extraout_var,iVar2);
      t[0] = (char)iVar2;
      iVar2 = (int)t[0];
      if ((4 < iVar2 - 9U) && (iVar2 != 0x20)) {
        if (iVar2 == 0x3e) {
          this->eod = true;
        }
        else {
          if (5 < iVar2 - 0x41U && 9 < iVar2 - 0x30U) {
            t[1] = '\0';
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            s_abi_cxx11_(&local_68,"character out of range during base Hex decode: ",0x2f);
            std::operator+(&local_48,&local_68,t);
            std::runtime_error::runtime_error(this_00,(string *)&local_48);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar1 = this->pos;
          this->pos = sVar1 + 1;
          this->inbuf[sVar1] = t[0];
          if (this->pos != 2) goto LAB_0012a5ce;
        }
        flush(this);
        in_RAX = extraout_RAX;
      }
LAB_0012a5ce:
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (this->eod != true);
  }
  return in_RAX;
}

Assistant:

void
Pl_ASCIIHexDecoder::write(unsigned char const* buf, size_t len)
{
    if (this->eod) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        char ch = static_cast<char>(toupper(buf[i]));
        switch (ch) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCIIHexDecoder ignore space");
            // ignore whitespace
            break;

        case '>':
            this->eod = true;
            flush();
            break;

        default:
            if (((ch >= '0') && (ch <= '9')) || ((ch >= 'A') && (ch <= 'F'))) {
                this->inbuf[this->pos++] = ch;
                if (this->pos == 2) {
                    flush();
                }
            } else {
                char t[2];
                t[0] = ch;
                t[1] = 0;
                throw std::runtime_error("character out of range during base Hex decode: "s + t);
            }
            break;
        }
        if (this->eod) {
            break;
        }
    }
}